

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

int main(void)

{
  char *pcVar1;
  StrX msg;
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  test_dt_string();
  test_dt_boolean();
  test_dt_decimal();
  test_dt_float();
  test_dt_double();
  test_dt_duration();
  test_dt_dateTime();
  test_dt_time();
  test_dt_date();
  test_dt_gYearMonth();
  test_dt_gYear();
  test_dt_gMonthDay();
  test_dt_gDay();
  test_dt_gMonth();
  test_dt_hexBinary();
  test_dt_base64Binary();
  test_dt_anyURI();
  test_dt_QName();
  test_dt_NOTATION();
  test_dt_normalizedString();
  test_dt_token();
  test_dt_language();
  test_dt_NMTOKEN();
  test_dt_NMTOKENS();
  test_dt_Name();
  test_dt_NCName_ID_IDREF_ENTITY(dt_NCName);
  test_dt_NCName_ID_IDREF_ENTITY(dt_ID);
  test_dt_NCName_ID_IDREF_ENTITY(dt_IDREF);
  test_dt_IDREFS_ENTITIES(dt_IDREFS);
  test_dt_NCName_ID_IDREF_ENTITY(dt_ENTITY);
  test_dt_IDREFS_ENTITIES(dt_ENTITIES);
  test_dt_integer();
  test_dt_nonPositiveInteger();
  test_dt_negativeInteger();
  test_dt_long();
  test_dt_int();
  test_dt_short();
  test_dt_byte();
  test_dt_nonNegativeInteger();
  test_dt_unsignedLong();
  test_dt_unsignedInt();
  test_dt_unsignedShort();
  test_dt_unsignedByte();
  test_dt_positiveInteger();
  test_DataType();
  pcVar1 = "Pass";
  if (errSeen != '\0') {
    pcVar1 = "Fail";
  }
  printf("\nXSValueTest %s\n",pcVar1);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 0;
}

Assistant:

int main()
{

    // Initialize the XML4C system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        StrX msg(toCatch.getMessage());
        std::cerr << "Error during initialization! Message:\n"
            << msg << std::endl;
        return 1;
    }

    test_dt_string();
    test_dt_boolean();
    test_dt_decimal();
    test_dt_float();
    test_dt_double();
    test_dt_duration();
    test_dt_dateTime();
    test_dt_time();
    test_dt_date();
    test_dt_gYearMonth();
    test_dt_gYear();
    test_dt_gMonthDay();
    test_dt_gDay();
    test_dt_gMonth();
    test_dt_hexBinary();
    test_dt_base64Binary();
    test_dt_anyURI();
    test_dt_QName();
    test_dt_NOTATION();
    test_dt_normalizedString();
    test_dt_token();
    test_dt_language();
    test_dt_NMTOKEN();
    test_dt_NMTOKENS();
    test_dt_Name();
    test_dt_NCName_ID_IDREF_ENTITY(XSValue::dt_NCName);
    test_dt_NCName_ID_IDREF_ENTITY(XSValue::dt_ID);
    test_dt_NCName_ID_IDREF_ENTITY(XSValue::dt_IDREF);
    test_dt_IDREFS_ENTITIES(XSValue::dt_IDREFS);
    test_dt_NCName_ID_IDREF_ENTITY(XSValue::dt_ENTITY);
    test_dt_IDREFS_ENTITIES(XSValue::dt_ENTITIES);
    test_dt_integer();
    test_dt_nonPositiveInteger();
    test_dt_negativeInteger();
    test_dt_long();
    test_dt_int();
    test_dt_short();
    test_dt_byte();
    test_dt_nonNegativeInteger();
    test_dt_unsignedLong();
    test_dt_unsignedInt();
    test_dt_unsignedShort();
    test_dt_unsignedByte();
    test_dt_positiveInteger();

    test_DataType();

    printf("\nXSValueTest %s\n", errSeen? "Fail" : "Pass");

    // And call the termination method
    XMLPlatformUtils::Terminate();

    return 0;
}